

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O3

BrailleCanvas * __thiscall
plot::BrailleCanvas::path<plot::GenericPoint<long>const*>
          (BrailleCanvas *this,Color *color,GenericPoint<long> *first,GenericPoint<long> *last,
          TerminalOp op)

{
  long lVar1;
  long lVar2;
  BrailleCanvas *pBVar3;
  long lVar4;
  long lVar5;
  Point *pPVar6;
  Point from;
  
  push(this);
  pPVar6 = first + 1;
  if (pPVar6 != last) {
    lVar4 = first->y;
    lVar5 = first->x;
    do {
      lVar1 = pPVar6->x;
      lVar2 = pPVar6->y;
      from.y = lVar4;
      from.x = lVar5;
      line(this,color,from,*pPVar6,Over);
      pPVar6 = pPVar6 + 1;
      lVar4 = lVar2;
      lVar5 = lVar1;
    } while (pPVar6 != last);
  }
  pBVar3 = pop(this,op);
  return pBVar3;
}

Assistant:

BrailleCanvas& path(Color const& color, Iterator first, Iterator last, TerminalOp op = TerminalOp::Over) {
        push();
        auto start = *first;
        while (++first != last) {
            auto end_ = *first;
            line(color, start, end_, TerminalOp::Over);
            start = end_;
        }
        return pop(op);
    }